

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.h
# Opt level: O0

int __thiscall cppcms::session_interface::get<int>(session_interface *this,string *key)

{
  byte bVar1;
  undefined8 *puVar2;
  int value;
  istringstream ss;
  undefined6 in_stack_fffffffffffffe10;
  byte in_stack_fffffffffffffe16;
  int local_1cc;
  locale local_1c8 [24];
  string local_1b0 [16];
  string *in_stack_fffffffffffffe60;
  session_interface *in_stack_fffffffffffffe68;
  istringstream local_190 [400];
  
  get(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,_S_in);
  std::__cxx11::string::~string(local_1b0);
  std::locale::classic();
  std::ios::imbue(local_1c8);
  std::locale::~locale(local_1c8);
  std::istream::operator>>(local_190,&local_1cc);
  bVar1 = std::ios::fail();
  if (((bVar1 & 1) == 0) &&
     (in_stack_fffffffffffffe16 = std::ios::eof(), (in_stack_fffffffffffffe16 & 1) != 0)) {
    std::__cxx11::istringstream::~istringstream(local_190);
    return local_1cc;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[4] = 0;
  booster::bad_cast::bad_cast
            ((bad_cast *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)));
  __cxa_throw(puVar2,&booster::bad_cast::typeinfo,booster::bad_cast::~bad_cast);
}

Assistant:

T get(std::string const &key)
	{
		std::istringstream ss(get(key));
		ss.imbue(std::locale::classic());
		T value;
		ss>>value;
		if(ss.fail() || !ss.eof())
			throw booster::bad_cast();
		return value;
	}